

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void EMIT_OP_RPTR(CodeGenGenericContext *ctx,x86Command op,x86Size size,x86Reg index,int multiplier,
                 x86Reg base,uint shift)

{
  x86Instruction *pxVar1;
  x86Argument arg_00;
  uint uVar2;
  x86Reg xVar3;
  int iVar4;
  x86Reg xVar5;
  ulong uVar6;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Argument arg;
  x86Argument local_50;
  
  base_local = base;
  multiplier_local = multiplier;
  index_local = index;
  if (ctx->skipTracking == false) {
    CodeGenGenericContext::RedirectAddressComputation
              (ctx,&index_local,&multiplier_local,&base_local,&shift);
    ctx->genRegRead[base_local] = true;
    ctx->genRegRead[index_local] = true;
  }
  xVar5 = index_local;
  iVar4 = multiplier_local;
  xVar3 = base_local;
  uVar2 = shift;
  arg.type = argPtr;
  arg.field_1.ptrSize = size;
  arg.ptrBase = base_local;
  arg.ptrIndex = index_local;
  arg.ptrMult = multiplier_local;
  arg.ptrNum = shift;
  CodeGenGenericContext::MemRead(ctx,&arg);
  uVar6 = (ulong)(op - o_call);
  if (op - o_call < 0x3c) {
    if ((0x810000000001004U >> (uVar6 & 0x3f) & 1) != 0) {
      arg_00._4_4_ = arg._4_4_;
      arg_00.type = arg.type;
      arg_00.field_1.imm64Arg._4_4_ = arg.field_1.imm64Arg._4_4_;
      arg_00.field_1.reg = arg.field_1.reg;
      arg_00.ptrIndex = arg.ptrIndex;
      arg_00.ptrBase = arg.ptrBase;
      arg_00.ptrNum = arg.ptrNum;
      arg_00.ptrMult = arg.ptrMult;
      CodeGenGenericContext::InvalidateAddressValue(ctx,arg_00);
      local_50.type = argNone;
      local_50.field_1.imm64Arg = 0;
      local_50.ptrBase = rNONE;
      local_50.ptrIndex = rNONE;
      local_50.ptrMult = 0;
      local_50.ptrNum = 0;
      CodeGenGenericContext::MemWrite(ctx,&arg,&local_50);
      goto LAB_001b8d86;
    }
    if ((0x100000000000100U >> (uVar6 & 0x3f) & 1) != 0) {
      CodeGenGenericContext::ReadAndModifyRegister(ctx,rEAX);
      CodeGenGenericContext::ReadAndModifyRegister(ctx,rEDX);
      ctx->genRegRead[1] = true;
      ctx->genRegRead[4] = true;
      goto LAB_001b8d86;
    }
    if (uVar6 == 0) {
      if (ctx->skipTracking == false) {
        CodeGenGenericContext::KillUnreadRegisters(ctx);
        CodeGenGenericContext::InvalidateState(ctx);
      }
      goto LAB_001b8d86;
    }
  }
  if (1 < op - o_push) {
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x436,
                  "void EMIT_OP_RPTR(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int)"
                 );
  }
LAB_001b8d86:
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argPtr;
  (pxVar1->argA).field_1.ptrSize = size;
  pxVar1 = ctx->x86Op;
  (pxVar1->argA).ptrIndex = xVar5;
  (pxVar1->argA).ptrMult = iVar4;
  (pxVar1->argA).ptrBase = xVar3;
  (pxVar1->argA).ptrNum = uVar2;
  (pxVar1->argB).type = argNone;
  ctx->x86Op = pxVar1 + 1;
  return;
}

Assistant:

void EMIT_OP_RPTR(CodeGenGenericContext &ctx, x86Command op, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift)
{
#ifdef NULLC_OPTIMIZE_X86
	if(!ctx.skipTracking)
	{
		ctx.RedirectAddressComputation(index, multiplier, base, shift);

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);
	}

	x86Argument arg = x86Argument(size, index, multiplier, base, shift);

	ctx.MemRead(arg);

	switch(op)
	{
	case o_push:
	case o_pop:
		break;
	case o_neg:
	case o_not:
	case o_neg64:
	case o_not64:
		ctx.InvalidateAddressValue(arg);

		ctx.MemWrite(arg, x86Argument());
		break;
	case o_idiv:
	case o_idiv64:
		ctx.ReadAndModifyRegister(rEAX);
		ctx.ReadAndModifyRegister(rEDX);

		// Implicitly read the result so when one of the registers is killed, it will not remove the instruction (there's room for improvement)
		ctx.ReadRegister(rEAX);
		ctx.ReadRegister(rEDX);
		break;
	case o_call:
		if(ctx.skipTracking)
			break;

		ctx.KillUnreadRegisters();

		ctx.InvalidateState();
		break;
	default:
		assert(!"unknown instruction");
	}
#else
	if(op == o_call)
		ctx.InvalidateState();
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argPtr;
	ctx.x86Op->argA.ptrSize = size;
	ctx.x86Op->argA.ptrIndex = index;
	ctx.x86Op->argA.ptrMult = multiplier;
	ctx.x86Op->argA.ptrBase = base;
	ctx.x86Op->argA.ptrNum = shift;
	ctx.x86Op->argB.type = x86Argument::argNone;
	ctx.x86Op++;
}